

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void * prf_array_fit(void *id)

{
  void *pvVar1;
  
  pvVar1 = prf_array_set_size(id,*(uint *)((long)id + -4) >> 4);
  return pvVar1;
}

Assistant:

void *
prf_array_fit(void *id)
{
  return prf_array_set_size(id, id_to_array(id)->numelem);
}